

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O1

int Dsd_CheckRootFunctionIdentity(DdManager *dd,DdNode *bF1,DdNode *bF2,DdNode *bC1,DdNode *bC2)

{
  Dsd_Entry_t *pDVar1;
  ulong uVar2;
  Dds_Cache_t *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DdNode **ppDVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  ulong uVar13;
  DdNode *g;
  DdNode **ppDVar14;
  DdNode *pDVar15;
  DdNode *apDStack_b8 [4];
  int aiStack_98 [4];
  DdNode *apDStack_88 [4];
  DdNode *apDStack_68 [4];
  uint *apuStack_48 [5];
  
  ppDVar7 = apDStack_b8;
  pDVar15 = dd->one;
  pDVar12 = (DdNode *)((ulong)pDVar15 ^ 1);
  if (pDVar12 == bC1) {
    __assert_fail("bC1 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa0,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar12 == bC2) {
    __assert_fail("bC2 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa1,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar15 == bC2 && pDVar15 == bC1) {
    return (uint)(bF1 == bF2);
  }
  pDVar11 = bC2;
  if (pDVar12 == bF1) {
    g = (DdNode *)((ulong)bF2 ^ 1);
LAB_0092057a:
    iVar6 = Cudd_bddLeq(dd,pDVar11,g);
    return iVar6;
  }
  g = bF2;
  if (pDVar15 == bF1) goto LAB_0092057a;
  pDVar11 = bC1;
  if (pDVar12 == bF2) {
    g = (DdNode *)((ulong)bF1 ^ 1);
    goto LAB_0092057a;
  }
  g = bF1;
  if (pDVar15 == bF2) goto LAB_0092057a;
  pDVar1 = pCache->pTable;
  uVar9 = (ulong)(((((long)&bF1->index + (long)&bF2->index) * 0xc00005 + (long)bC1) * 0x40f1f9 +
                  (long)bC2) * 0xb5051) % (ulong)(long)pCache->nTableSize & 0xffffffff;
  if ((((pDVar1[uVar9].bX[0] == bF1) && (pDVar1[uVar9].bX[1] == bF2)) &&
      (pDVar1[uVar9].bX[2] == bC1)) && (pDVar1[uVar9].bX[3] == bC2)) {
    pCache->nSuccess = pCache->nSuccess + 1;
    return *(int *)(pDVar1[uVar9].bX + 4);
  }
  apDStack_68[0] = bF1;
  apDStack_68[1] = bF2;
  apDStack_68[2] = bC1;
  apDStack_68[3] = bC2;
  apuStack_48[0] = (uint *)((ulong)bF1 & 0xfffffffffffffffe);
  apuStack_48[1] = (uint *)((ulong)bF2 & 0xfffffffffffffffe);
  apuStack_48[2] = (uint *)((ulong)bC1 & 0xfffffffffffffffe);
  apuStack_48[3] = (uint *)((ulong)bC2 & 0xfffffffffffffffe);
  uVar13 = (ulong)*(uint *)((ulong)bF1 & 0xfffffffffffffffe);
  aiStack_98[1] = 0x7fffffff;
  aiStack_98[0] = 0x7fffffff;
  if (uVar13 != 0x7fffffff) {
    aiStack_98[0] = dd->perm[uVar13];
  }
  uVar13 = (ulong)*(uint *)((ulong)bF2 & 0xfffffffffffffffe);
  if (uVar13 != 0x7fffffff) {
    aiStack_98[1] = dd->perm[uVar13];
  }
  uVar13 = (ulong)*(uint *)((ulong)bC1 & 0xfffffffffffffffe);
  iVar5 = 0x7fffffff;
  iVar6 = 0x7fffffff;
  if (uVar13 != 0x7fffffff) {
    iVar6 = dd->perm[uVar13];
  }
  aiStack_98[2] = iVar6;
  uVar13 = (ulong)*(uint *)((ulong)bC2 & 0xfffffffffffffffe);
  if (uVar13 != 0x7fffffff) {
    iVar5 = dd->perm[uVar13];
  }
  aiStack_98[3] = iVar5;
  pCache->nFailure = pCache->nFailure + 1;
  iVar8 = 0x7fffffff;
  lVar10 = 0;
  do {
    iVar4 = aiStack_98[lVar10];
    if (iVar8 < aiStack_98[lVar10]) {
      iVar4 = iVar8;
    }
    iVar8 = iVar4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    uVar13 = *(ulong *)((long)apDStack_68 + lVar10 * 2);
    if (iVar8 == *(int *)((long)aiStack_98 + lVar10)) {
      uVar2 = *(ulong *)((long)apuStack_48 + lVar10 * 2);
      if (uVar13 == uVar2) {
        *(ulong *)((long)apDStack_88 + lVar10 * 2) = *(ulong *)(uVar2 + 0x18);
        uVar13 = *(ulong *)(uVar2 + 0x10);
        ppDVar14 = apDStack_b8;
      }
      else {
        *(ulong *)((long)apDStack_88 + lVar10 * 2) = *(ulong *)(uVar2 + 0x18) ^ 1;
        uVar13 = *(ulong *)(uVar2 + 0x10) ^ 1;
        ppDVar14 = apDStack_b8;
      }
    }
    else {
      *(ulong *)((long)apDStack_b8 + lVar10 * 2) = uVar13;
      ppDVar14 = apDStack_88;
    }
    *(ulong *)((long)ppDVar14 + lVar10 * 2) = uVar13;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  if ((iVar8 == iVar6) && (iVar8 == iVar5)) {
    ppDVar7 = apDStack_88;
    if (apDStack_88[2] == pDVar12) {
      ppDVar7 = apDStack_b8;
      apDStack_88[2] = apDStack_b8[2];
    }
    apDStack_b8[0] = *ppDVar7;
    ppDVar7 = apDStack_88;
    if (apDStack_88[3] == pDVar12) {
      ppDVar7 = apDStack_b8;
    }
    apDStack_b8[1] = ppDVar7[1];
    if (apDStack_88[3] == pDVar12) {
      apDStack_88[3] = apDStack_b8[3];
    }
  }
  else {
    if ((iVar8 == iVar6) && (iVar8 != iVar5)) {
      pDVar15 = apDStack_b8[2];
      if (apDStack_88[2] != pDVar12) {
        ppDVar7 = apDStack_88;
        pDVar15 = apDStack_88[2];
      }
      pDVar12 = *ppDVar7;
      iVar6 = Dsd_CheckRootFunctionIdentity_rec(dd,pDVar12,apDStack_88[1],pDVar15,apDStack_88[3]);
      apDStack_b8[0] = pDVar12;
      apDStack_88[2] = pDVar15;
      apDStack_88[3] = apDStack_b8[3];
    }
    else if ((iVar8 == iVar6) || (iVar8 != iVar5)) {
      iVar6 = Dsd_CheckRootFunctionIdentity_rec
                        (dd,apDStack_88[0],apDStack_88[1],apDStack_88[2],apDStack_88[3]);
      apDStack_88[2] = apDStack_b8[2];
      apDStack_88[3] = apDStack_b8[3];
    }
    else {
      pDVar15 = apDStack_88[3];
      ppDVar7 = apDStack_88;
      if (apDStack_88[3] == pDVar12) {
        pDVar15 = apDStack_b8[3];
        ppDVar7 = apDStack_b8;
      }
      apDStack_b8[1] = ppDVar7[1];
      iVar6 = Dsd_CheckRootFunctionIdentity_rec
                        (dd,apDStack_88[0],apDStack_b8[1],apDStack_88[2],pDVar15);
      apDStack_88[2] = apDStack_b8[2];
      apDStack_88[3] = pDVar15;
    }
    if (iVar6 != 1) goto LAB_0092051e;
  }
  iVar6 = Dsd_CheckRootFunctionIdentity_rec
                    (dd,apDStack_b8[0],apDStack_b8[1],apDStack_88[2],apDStack_88[3]);
LAB_0092051e:
  pDVar3 = pCache;
  lVar10 = 0;
  do {
    pDVar3->pTable[uVar9].bX[lVar10] = apDStack_68[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  pCache->pTable[uVar9].bX[4] = (DdNode *)(long)iVar6;
  return iVar6;
}

Assistant:

int Dsd_CheckRootFunctionIdentity( DdManager * dd, DdNode * bF1, DdNode * bF2, DdNode * bC1, DdNode * bC2 )
{
    int RetValue;
//  pCache->nSuccess = 0;
//  pCache->nFailure = 0;
    RetValue = Dsd_CheckRootFunctionIdentity_rec(dd, bF1, bF2, bC1, bC2);
//  printf( "Cache success = %d. Cache failure = %d.\n", pCache->nSuccess, pCache->nFailure );
    return RetValue;
}